

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Platform.cpp
# Opt level: O2

void __thiscall
GmmLib::PlatformInfoGen9::PlatformInfoGen9
          (PlatformInfoGen9 *this,PLATFORM *Platform,Context *pGmmLibContext)

{
  GMM_PLATFORM_INFO *pGVar1;
  uint32_t uVar2;
  long lVar3;
  long lVar4;
  __GMM_BUFFER_TYPE *p_Var5;
  __GMM_BUFFER_TYPE *p_Var6;
  __GMM_BUFFER_TYPE *p_Var7;
  __GMM_BUFFER_TYPE *p_Var8;
  GMM_GFX_SIZE_T GVar9;
  byte bVar10;
  
  bVar10 = 0;
  PlatformInfo::PlatformInfo(&this->super_PlatformInfo,Platform,pGmmLibContext);
  (this->super_PlatformInfo)._vptr_PlatformInfo = (_func_int **)&PTR__PlatformInfo_001d2710;
  if (pGmmLibContext != (Context *)0x0) {
    (this->super_PlatformInfo).Data.Nndi.Alignment = 0x1000;
    (this->super_PlatformInfo).Data.Nndi.PitchAlignment = 1;
    (this->super_PlatformInfo).Data.Nndi.RenderPitchAlignment = 1;
    (this->super_PlatformInfo).Data.Nndi.LockPitchAlignment = 1;
    (this->super_PlatformInfo).Data.Nndi.MinPitch = 0x280;
    (this->super_PlatformInfo).Data.Nndi.MaxPitch = 0x2000;
    (this->super_PlatformInfo).Data.Nndi.MinAllocationSize = 0x1000;
    (this->super_PlatformInfo).Data.Nndi.MinHeight = 200;
    (this->super_PlatformInfo).Data.Nndi.MinWidth = 0x140;
    (this->super_PlatformInfo).Data.Nndi.MinDepth = 0;
    (this->super_PlatformInfo).Data.Nndi.MaxHeight = 0x600;
    (this->super_PlatformInfo).Data.Nndi.MaxWidth = 0x800;
    (this->super_PlatformInfo).Data.Nndi.MaxDepth = 1;
    (this->super_PlatformInfo).Data.Nndi.MaxArraySize = 1;
    (this->super_PlatformInfo).Data.Depth.Alignment = 0x1000;
    (this->super_PlatformInfo).Data.Depth.PitchAlignment = 0x40;
    (this->super_PlatformInfo).Data.Depth.RenderPitchAlignment = 0x40;
    (this->super_PlatformInfo).Data.Depth.LockPitchAlignment = 0x40;
    (this->super_PlatformInfo).Data.Depth.MinPitch = 0x40;
    (this->super_PlatformInfo).Data.Depth.MaxPitch = 0x20000;
    (this->super_PlatformInfo).Data.Depth.MinAllocationSize = 0x1000;
    (this->super_PlatformInfo).Data.Depth.MinHeight = 1;
    (this->super_PlatformInfo).Data.Depth.MinWidth = 1;
    (this->super_PlatformInfo).Data.Depth.MinDepth = 0;
    (this->super_PlatformInfo).Data.Depth.MaxHeight = 0x4000;
    (this->super_PlatformInfo).Data.Depth.MaxWidth = 0x4000;
    (this->super_PlatformInfo).Data.Depth.MaxDepth = 0x800;
    (this->super_PlatformInfo).Data.Depth.MaxArraySize = 0x800;
    (this->super_PlatformInfo).Data.Stencil.Alignment = 0x1000;
    (this->super_PlatformInfo).Data.Stencil.PitchAlignment = 0x80;
    (this->super_PlatformInfo).Data.Stencil.RenderPitchAlignment = 0x80;
    (this->super_PlatformInfo).Data.Stencil.LockPitchAlignment = 0x80;
    (this->super_PlatformInfo).Data.Stencil.MinPitch = 0x80;
    (this->super_PlatformInfo).Data.Stencil.MaxPitch = 0x20000;
    (this->super_PlatformInfo).Data.Stencil.MinAllocationSize = 0x1000;
    (this->super_PlatformInfo).Data.Stencil.MinHeight = 1;
    (this->super_PlatformInfo).Data.Stencil.MinWidth = 1;
    (this->super_PlatformInfo).Data.Stencil.MinDepth = 0;
    (this->super_PlatformInfo).Data.Stencil.MaxHeight = 0x4000;
    (this->super_PlatformInfo).Data.Stencil.MaxWidth = 0x4000;
    (this->super_PlatformInfo).Data.Stencil.MaxDepth = 0x800;
    (this->super_PlatformInfo).Data.Stencil.MaxArraySize = 0x800;
    (this->super_PlatformInfo).Data.HiZ.Alignment = 0x1000;
    (this->super_PlatformInfo).Data.HiZ.PitchAlignment = 0x80;
    (this->super_PlatformInfo).Data.HiZ.RenderPitchAlignment = 0x80;
    (this->super_PlatformInfo).Data.HiZ.LockPitchAlignment = 0x80;
    (this->super_PlatformInfo).Data.HiZ.MinPitch = 0x80;
    (this->super_PlatformInfo).Data.HiZ.MaxPitch = 0x20000;
    (this->super_PlatformInfo).Data.HiZ.MinAllocationSize = 0x1000;
    (this->super_PlatformInfo).Data.HiZ.MinHeight = 1;
    (this->super_PlatformInfo).Data.HiZ.MinWidth = 1;
    (this->super_PlatformInfo).Data.HiZ.MinDepth = 0;
    (this->super_PlatformInfo).Data.HiZ.MaxHeight = 0x4000;
    (this->super_PlatformInfo).Data.HiZ.MaxWidth = 0x4000;
    (this->super_PlatformInfo).Data.HiZ.MaxDepth = 0x800;
    (this->super_PlatformInfo).Data.HiZ.MaxArraySize = 0x800;
    (this->super_PlatformInfo).Data.Vertex.Alignment = 0x1000;
    (this->super_PlatformInfo).Data.Vertex.PitchAlignment = 1;
    (this->super_PlatformInfo).Data.Vertex.RenderPitchAlignment = 1;
    (this->super_PlatformInfo).Data.Vertex.LockPitchAlignment = 1;
    (this->super_PlatformInfo).Data.Vertex.MinPitch = 1;
    (this->super_PlatformInfo).Data.Vertex.MaxPitch = 0x80000000;
    (this->super_PlatformInfo).Data.Vertex.MinAllocationSize = 0x1000;
    (this->super_PlatformInfo).Data.Vertex.MinHeight = 1;
    (this->super_PlatformInfo).Data.Vertex.MinWidth = 1;
    (this->super_PlatformInfo).Data.Vertex.MinDepth = 0;
    (this->super_PlatformInfo).Data.Vertex.MaxHeight = 0x8000000;
    (this->super_PlatformInfo).Data.Vertex.MaxWidth = 0x80000000;
    (this->super_PlatformInfo).Data.Vertex.MaxDepth = 0x800;
    (this->super_PlatformInfo).Data.Vertex.MaxArraySize = 0x800;
    lVar4 = 0xc;
    p_Var6 = &(this->super_PlatformInfo).Data.Vertex;
    p_Var7 = &(this->super_PlatformInfo).Data.Index;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar2 = p_Var6->PitchAlignment;
      p_Var7->Alignment = p_Var6->Alignment;
      p_Var7->PitchAlignment = uVar2;
      p_Var6 = (__GMM_BUFFER_TYPE *)((long)p_Var6 + (ulong)bVar10 * -0x10 + 8);
      p_Var7 = (__GMM_BUFFER_TYPE *)((long)p_Var7 + (ulong)bVar10 * -0x10 + 8);
    }
    (this->super_PlatformInfo).Data.Linear.Alignment = 0x1000;
    (this->super_PlatformInfo).Data.Linear.PitchAlignment = 1;
    (this->super_PlatformInfo).Data.Linear.RenderPitchAlignment = 1;
    (this->super_PlatformInfo).Data.Linear.LockPitchAlignment = 1;
    (this->super_PlatformInfo).Data.Linear.MinPitch = 1;
    (this->super_PlatformInfo).Data.Linear.MaxPitch = 0x4000000000;
    (this->super_PlatformInfo).Data.Linear.MinAllocationSize = 0x1000;
    (this->super_PlatformInfo).Data.Linear.MinHeight = 1;
    (this->super_PlatformInfo).Data.Linear.MinWidth = 1;
    (this->super_PlatformInfo).Data.Linear.MinDepth = 0;
    (this->super_PlatformInfo).Data.Linear.MaxHeight = 1;
    (this->super_PlatformInfo).Data.Linear.MaxWidth = 0x4000000000;
    (this->super_PlatformInfo).Data.Linear.MaxDepth = 1;
    (this->super_PlatformInfo).Data.Linear.MaxArraySize = 1;
    (this->super_PlatformInfo).Data.NoRestriction.Alignment = 0x1000;
    (this->super_PlatformInfo).Data.NoRestriction.PitchAlignment = 1;
    (this->super_PlatformInfo).Data.NoRestriction.RenderPitchAlignment = 1;
    (this->super_PlatformInfo).Data.NoRestriction.LockPitchAlignment = 1;
    (this->super_PlatformInfo).Data.NoRestriction.MinPitch = 1;
    (this->super_PlatformInfo).Data.NoRestriction.MaxPitch = 0x800000000000;
    (this->super_PlatformInfo).Data.NoRestriction.MinAllocationSize = 0x1000;
    (this->super_PlatformInfo).Data.NoRestriction.MinHeight = 1;
    (this->super_PlatformInfo).Data.NoRestriction.MinWidth = 1;
    (this->super_PlatformInfo).Data.NoRestriction.MinDepth = 0;
    (this->super_PlatformInfo).Data.NoRestriction.MaxHeight = 0x4000000000;
    (this->super_PlatformInfo).Data.NoRestriction.MaxWidth = 0x800000000000;
    p_Var6 = &(this->super_PlatformInfo).Data.NoRestriction;
    (this->super_PlatformInfo).Data.NoRestriction.MaxDepth = 0x800;
    (this->super_PlatformInfo).Data.NoRestriction.MaxArraySize = 0x800;
    p_Var7 = p_Var6;
    p_Var5 = &(this->super_PlatformInfo).Data.Constant;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar2 = p_Var7->PitchAlignment;
      p_Var5->Alignment = p_Var7->Alignment;
      p_Var5->PitchAlignment = uVar2;
      p_Var7 = (__GMM_BUFFER_TYPE *)((long)p_Var7 + (ulong)bVar10 * -0x10 + 8);
      p_Var5 = (__GMM_BUFFER_TYPE *)((long)p_Var5 + (ulong)bVar10 * -0x10 + 8);
    }
    p_Var7 = p_Var6;
    p_Var5 = &(this->super_PlatformInfo).Data.StateDx9ConstantBuffer;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar2 = p_Var7->PitchAlignment;
      p_Var5->Alignment = p_Var7->Alignment;
      p_Var5->PitchAlignment = uVar2;
      p_Var7 = (__GMM_BUFFER_TYPE *)((long)p_Var7 + (ulong)bVar10 * -0x10 + 8);
      p_Var5 = (__GMM_BUFFER_TYPE *)((long)p_Var5 + (ulong)bVar10 * -0x10 + 8);
    }
    (this->super_PlatformInfo).Data.StateDx9ConstantBuffer.Alignment = 0x2000;
    p_Var7 = p_Var6;
    p_Var5 = &(this->super_PlatformInfo).Data.MotionComp;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar2 = p_Var7->PitchAlignment;
      p_Var5->Alignment = p_Var7->Alignment;
      p_Var5->PitchAlignment = uVar2;
      p_Var7 = (__GMM_BUFFER_TYPE *)((long)p_Var7 + (ulong)bVar10 * -0x10 + 8);
      p_Var5 = (__GMM_BUFFER_TYPE *)((long)p_Var5 + (ulong)bVar10 * -0x10 + 8);
    }
    (this->super_PlatformInfo).Data.MotionComp.Alignment = 0x1000;
    (this->super_PlatformInfo).Data.MotionComp.PitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.MotionComp.RenderPitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.MotionComp.LockPitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.MotionComp.MinPitch = 0x20;
    p_Var7 = p_Var6;
    p_Var5 = &(this->super_PlatformInfo).Data.Stream;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar2 = p_Var7->PitchAlignment;
      p_Var5->Alignment = p_Var7->Alignment;
      p_Var5->PitchAlignment = uVar2;
      p_Var7 = (__GMM_BUFFER_TYPE *)((long)p_Var7 + (ulong)bVar10 * -0x10 + 8);
      p_Var5 = (__GMM_BUFFER_TYPE *)((long)p_Var5 + (ulong)bVar10 * -0x10 + 8);
    }
    p_Var7 = p_Var6;
    p_Var5 = &(this->super_PlatformInfo).Data.InterlacedScan;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar2 = p_Var7->PitchAlignment;
      p_Var5->Alignment = p_Var7->Alignment;
      p_Var5->PitchAlignment = uVar2;
      p_Var7 = (__GMM_BUFFER_TYPE *)((long)p_Var7 + (ulong)bVar10 * -0x10 + 8);
      p_Var5 = (__GMM_BUFFER_TYPE *)((long)p_Var5 + (ulong)bVar10 * -0x10 + 8);
    }
    p_Var7 = &(this->super_PlatformInfo).Data.TextApi;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar2 = p_Var6->PitchAlignment;
      p_Var7->Alignment = p_Var6->Alignment;
      p_Var7->PitchAlignment = uVar2;
      p_Var6 = (__GMM_BUFFER_TYPE *)((long)p_Var6 + (ulong)bVar10 * -0x10 + 8);
      p_Var7 = (__GMM_BUFFER_TYPE *)((long)p_Var7 + (ulong)bVar10 * -0x10 + 8);
    }
    (this->super_PlatformInfo).Data.Texture2DSurface.Alignment = 0x1000;
    (this->super_PlatformInfo).Data.Texture2DSurface.PitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.Texture2DSurface.RenderPitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.Texture2DSurface.LockPitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.Texture2DSurface.MinPitch = 0x20;
    GVar9 = (ulong)((*(ulong *)&pGmmLibContext->WaTable >> 0x2c & 1) == 0) * 0x20000 + 0x20000;
    (this->super_PlatformInfo).Data.Texture2DSurface.MaxPitch = GVar9;
    (this->super_PlatformInfo).Data.Texture2DSurface.MinAllocationSize = 0x1000;
    (this->super_PlatformInfo).Data.Texture2DSurface.MinHeight = 1;
    (this->super_PlatformInfo).Data.Texture2DSurface.MinWidth = 1;
    (this->super_PlatformInfo).Data.Texture2DSurface.MinDepth = 0;
    (this->super_PlatformInfo).Data.Texture2DSurface.MaxHeight = 0x4000;
    (this->super_PlatformInfo).Data.Texture2DSurface.MaxWidth = 0x4000;
    (this->super_PlatformInfo).Data.Texture2DSurface.MaxDepth = 0xffffffff;
    (this->super_PlatformInfo).Data.Texture2DSurface.MaxArraySize = 0x800;
    p_Var6 = &(this->super_PlatformInfo).Data.Texture2DLinearSurface;
    p_Var7 = &(this->super_PlatformInfo).Data.Texture2DSurface;
    p_Var5 = p_Var6;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar2 = p_Var7->PitchAlignment;
      p_Var5->Alignment = p_Var7->Alignment;
      p_Var5->PitchAlignment = uVar2;
      p_Var7 = (__GMM_BUFFER_TYPE *)((long)p_Var7 + (ulong)bVar10 * -0x10 + 8);
      p_Var5 = (__GMM_BUFFER_TYPE *)((long)p_Var5 + (ulong)bVar10 * -0x10 + 8);
    }
    (this->super_PlatformInfo).Data.Texture2DLinearSurface.PitchAlignment = 0x40;
    (this->super_PlatformInfo).Data.Texture2DLinearSurface.RenderPitchAlignment = 0x40;
    (this->super_PlatformInfo).Data.Texture2DLinearSurface.LockPitchAlignment = 0x40;
    (this->super_PlatformInfo).Data.ASyncFlipSurface.Alignment = 0x40000;
    (this->super_PlatformInfo).Data.ASyncFlipSurface.PitchAlignment = 0x40;
    (this->super_PlatformInfo).Data.ASyncFlipSurface.RenderPitchAlignment = 0x40;
    (this->super_PlatformInfo).Data.ASyncFlipSurface.LockPitchAlignment = 0x40;
    (this->super_PlatformInfo).Data.ASyncFlipSurface.MinPitch = 0x40;
    (this->super_PlatformInfo).Data.ASyncFlipSurface.MaxPitch = GVar9;
    (this->super_PlatformInfo).Data.ASyncFlipSurface.MinAllocationSize = 0x1000;
    (this->super_PlatformInfo).Data.ASyncFlipSurface.MinHeight = 1;
    (this->super_PlatformInfo).Data.ASyncFlipSurface.MinWidth = 1;
    (this->super_PlatformInfo).Data.ASyncFlipSurface.MinDepth = 0;
    (this->super_PlatformInfo).Data.ASyncFlipSurface.MaxHeight = 0x4000;
    (this->super_PlatformInfo).Data.ASyncFlipSurface.MaxWidth = 0x4000;
    (this->super_PlatformInfo).Data.ASyncFlipSurface.MaxDepth = 1;
    (this->super_PlatformInfo).Data.ASyncFlipSurface.MaxArraySize = 0x800;
    p_Var7 = &(this->super_PlatformInfo).Data.ASyncFlipSurface;
    p_Var5 = p_Var7;
    p_Var8 = &(this->super_PlatformInfo).Data.HardwareMBM;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar2 = p_Var5->PitchAlignment;
      p_Var8->Alignment = p_Var5->Alignment;
      p_Var8->PitchAlignment = uVar2;
      p_Var5 = (__GMM_BUFFER_TYPE *)((long)p_Var5 + (ulong)bVar10 * -0x10 + 8);
      p_Var8 = (__GMM_BUFFER_TYPE *)((long)p_Var8 + (ulong)bVar10 * -0x10 + 8);
    }
    p_Var5 = &(this->super_PlatformInfo).Data.Video;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar2 = p_Var6->PitchAlignment;
      p_Var5->Alignment = p_Var6->Alignment;
      p_Var5->PitchAlignment = uVar2;
      p_Var6 = (__GMM_BUFFER_TYPE *)((long)p_Var6 + (ulong)bVar10 * -0x10 + 8);
      p_Var5 = (__GMM_BUFFER_TYPE *)((long)p_Var5 + (ulong)bVar10 * -0x10 + 8);
    }
    p_Var6 = &(this->super_PlatformInfo).Data.Overlay;
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar2 = p_Var7->PitchAlignment;
      p_Var6->Alignment = p_Var7->Alignment;
      p_Var6->PitchAlignment = uVar2;
      p_Var7 = (__GMM_BUFFER_TYPE *)((long)p_Var7 + (ulong)bVar10 * -0x10 + 8);
      p_Var6 = (__GMM_BUFFER_TYPE *)((long)p_Var6 + (ulong)bVar10 * -0x10 + 8);
    }
    (this->super_PlatformInfo).Data.CubeSurface.Alignment = 0x1000;
    (this->super_PlatformInfo).Data.CubeSurface.PitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.CubeSurface.RenderPitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.CubeSurface.LockPitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.CubeSurface.MinPitch = 0x20;
    (this->super_PlatformInfo).Data.CubeSurface.MaxPitch =
         (ulong)((*(ulong *)&pGmmLibContext->WaTable >> 0x2c & 1) == 0) * 0x20000 + 0x20000;
    (this->super_PlatformInfo).Data.CubeSurface.MinAllocationSize = 0x1000;
    (this->super_PlatformInfo).Data.CubeSurface.MinHeight = 1;
    (this->super_PlatformInfo).Data.CubeSurface.MinWidth = 1;
    (this->super_PlatformInfo).Data.CubeSurface.MinDepth = 0;
    (this->super_PlatformInfo).Data.CubeSurface.MaxHeight = 0x4000;
    (this->super_PlatformInfo).Data.CubeSurface.MaxWidth = 0x4000;
    (this->super_PlatformInfo).Data.CubeSurface.MaxDepth = 1;
    (this->super_PlatformInfo).Data.CubeSurface.MaxArraySize = 0x155;
    (this->super_PlatformInfo).Data.Texture3DSurface.Alignment = 0x1000;
    (this->super_PlatformInfo).Data.Texture3DSurface.PitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.Texture3DSurface.RenderPitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.Texture3DSurface.LockPitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.Texture3DSurface.MinPitch = 0x20;
    (this->super_PlatformInfo).Data.Texture3DSurface.MaxPitch =
         (ulong)((*(ulong *)&pGmmLibContext->WaTable >> 0x2c & 1) == 0) * 0x20000 + 0x20000;
    (this->super_PlatformInfo).Data.Texture3DSurface.MinAllocationSize = 0x1000;
    (this->super_PlatformInfo).Data.Texture3DSurface.MinHeight = 1;
    (this->super_PlatformInfo).Data.Texture3DSurface.MinWidth = 1;
    (this->super_PlatformInfo).Data.Texture3DSurface.MinDepth = 0;
    (this->super_PlatformInfo).Data.Texture3DSurface.MaxHeight = 0x4000;
    (this->super_PlatformInfo).Data.Texture3DSurface.MaxWidth = 0x4000;
    (this->super_PlatformInfo).Data.Texture3DSurface.MaxDepth = 0x800;
    (this->super_PlatformInfo).Data.Texture3DSurface.MaxArraySize = 0xffffffff;
    (this->super_PlatformInfo).Data.BufferType.Alignment = 0x1000;
    (this->super_PlatformInfo).Data.BufferType.PitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.BufferType.RenderPitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.BufferType.LockPitchAlignment = 0x20;
    (this->super_PlatformInfo).Data.BufferType.MinPitch = 0x20;
    (this->super_PlatformInfo).Data.BufferType.MaxPitch = 0x4000000000;
    (this->super_PlatformInfo).Data.BufferType.MinAllocationSize = 0x1000;
    (this->super_PlatformInfo).Data.BufferType.MinHeight = 0;
    (this->super_PlatformInfo).Data.BufferType.MinWidth = 1;
    (this->super_PlatformInfo).Data.BufferType.MinDepth = 0;
    (this->super_PlatformInfo).Data.BufferType.MaxHeight = 1;
    (this->super_PlatformInfo).Data.BufferType.MaxWidth = 0x4000000000;
    (this->super_PlatformInfo).Data.BufferType.MaxDepth = 0xffffffff;
    (this->super_PlatformInfo).Data.BufferType.MaxArraySize = 0x80000000;
    uVar2 = 0x4000;
    if ((*(ulong *)&pGmmLibContext->WaTable >> 0x22 & 1) == 0) {
      uVar2 = 0x1000;
    }
    (this->super_PlatformInfo).Data.Cursor.Alignment = uVar2;
    (this->super_PlatformInfo).Data.Cursor.PitchAlignment = 1;
    (this->super_PlatformInfo).Data.Cursor.RenderPitchAlignment = 1;
    (this->super_PlatformInfo).Data.Cursor.LockPitchAlignment = 1;
    (this->super_PlatformInfo).Data.Cursor.MinPitch = 1;
    (this->super_PlatformInfo).Data.Cursor.MaxPitch = 0xffffffff;
    (this->super_PlatformInfo).Data.Cursor.MinAllocationSize = 1;
    (this->super_PlatformInfo).Data.Cursor.MinHeight = 1;
    (this->super_PlatformInfo).Data.Cursor.MinWidth = 1;
    (this->super_PlatformInfo).Data.Cursor.MinDepth = 0;
    (this->super_PlatformInfo).Data.Cursor.MaxHeight = 0xffffffff;
    (this->super_PlatformInfo).Data.Cursor.MaxWidth = 0xffffffff;
    (this->super_PlatformInfo).Data.Cursor.MaxDepth = 0xffffffff;
    (this->super_PlatformInfo).Data.Cursor.MaxArraySize = 1;
    (this->super_PlatformInfo).Data.TileInfo[1].LogicalTileWidth = 0x200;
    (this->super_PlatformInfo).Data.TileInfo[1].LogicalTileHeight = 8;
    (this->super_PlatformInfo).Data.TileInfo[1].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[1].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[1].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[1].MaxMipTailStartWidth = 0;
    (this->super_PlatformInfo).Data.TileInfo[1].MaxMipTailStartHeight = 0;
    (this->super_PlatformInfo).Data.TileInfo[1].MaxMipTailStartDepth = 0;
    (this->super_PlatformInfo).Data.TileInfo[2].LogicalTileWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[2].LogicalTileHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[2].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[2].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[2].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[2].MaxMipTailStartWidth = 0;
    (this->super_PlatformInfo).Data.TileInfo[2].MaxMipTailStartHeight = 0;
    (this->super_PlatformInfo).Data.TileInfo[2].MaxMipTailStartDepth = 0;
    (this->super_PlatformInfo).Data.TileInfo[0xc].LogicalTileWidth = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0xc].LogicalTileHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[0xc].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0xc].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0xc].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0xc].MaxMipTailStartWidth = 0x800;
    (this->super_PlatformInfo).Data.TileInfo[0xc].MaxMipTailStartHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[0xc].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0xb].LogicalTileWidth = 0x2000;
    (this->super_PlatformInfo).Data.TileInfo[0xb].LogicalTileHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[0xb].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0xb].LogicalSize = 0x2000;
    (this->super_PlatformInfo).Data.TileInfo[0xb].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0xb].MaxMipTailStartWidth = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0xb].MaxMipTailStartHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[0xb].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[10].LogicalTileWidth = 0x4000;
    (this->super_PlatformInfo).Data.TileInfo[10].LogicalTileHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[10].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[10].LogicalSize = 0x4000;
    (this->super_PlatformInfo).Data.TileInfo[10].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[10].MaxMipTailStartWidth = 0x2000;
    (this->super_PlatformInfo).Data.TileInfo[10].MaxMipTailStartHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[10].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[9].LogicalTileWidth = 0x8000;
    (this->super_PlatformInfo).Data.TileInfo[9].LogicalTileHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[9].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[9].LogicalSize = 0x8000;
    (this->super_PlatformInfo).Data.TileInfo[9].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[9].MaxMipTailStartWidth = 0x4000;
    (this->super_PlatformInfo).Data.TileInfo[9].MaxMipTailStartHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[9].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[8].LogicalTileWidth = 0x10000;
    (this->super_PlatformInfo).Data.TileInfo[8].LogicalTileHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[8].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[8].LogicalSize = 0x10000;
    (this->super_PlatformInfo).Data.TileInfo[8].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[8].MaxMipTailStartWidth = 0x8000;
    (this->super_PlatformInfo).Data.TileInfo[8].MaxMipTailStartHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[8].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x2f].LogicalTileWidth = 0x400;
    (this->super_PlatformInfo).Data.TileInfo[0x2f].LogicalTileHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x2f].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x2f].LogicalSize = 0x10000;
    (this->super_PlatformInfo).Data.TileInfo[0x2f].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x2f].MaxMipTailStartWidth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x2f].MaxMipTailStartHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x2f].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x2e].LogicalTileWidth = 0x400;
    (this->super_PlatformInfo).Data.TileInfo[0x2e].LogicalTileHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x2e].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x2e].LogicalSize = 0x10000;
    (this->super_PlatformInfo).Data.TileInfo[0x2e].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x2e].MaxMipTailStartWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x2e].MaxMipTailStartHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x2e].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x2d].LogicalTileWidth = 0x200;
    (this->super_PlatformInfo).Data.TileInfo[0x2d].LogicalTileHeight = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x2d].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x2d].LogicalSize = 0x10000;
    (this->super_PlatformInfo).Data.TileInfo[0x2d].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x2d].MaxMipTailStartWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x2d].MaxMipTailStartHeight = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x2d].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x2c].LogicalTileWidth = 0x200;
    (this->super_PlatformInfo).Data.TileInfo[0x2c].LogicalTileHeight = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x2c].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x2c].LogicalSize = 0x10000;
    (this->super_PlatformInfo).Data.TileInfo[0x2c].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x2c].MaxMipTailStartWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x2c].MaxMipTailStartHeight = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x2c].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x2b].LogicalTileWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x2b].LogicalTileHeight = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x2b].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x2b].LogicalSize = 0x10000;
    (this->super_PlatformInfo).Data.TileInfo[0x2b].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x2b].MaxMipTailStartWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x2b].MaxMipTailStartHeight = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x2b].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x34].LogicalTileWidth = 0x200;
    (this->super_PlatformInfo).Data.TileInfo[0x34].LogicalTileHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x34].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x34].LogicalSize = 0x8000;
    (this->super_PlatformInfo).Data.TileInfo[0x34].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x34].MaxMipTailStartWidth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x34].MaxMipTailStartHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x34].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x33].LogicalTileWidth = 0x200;
    (this->super_PlatformInfo).Data.TileInfo[0x33].LogicalTileHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x33].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x33].LogicalSize = 0x8000;
    (this->super_PlatformInfo).Data.TileInfo[0x33].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x33].MaxMipTailStartWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x33].MaxMipTailStartHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x33].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x32].LogicalTileWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x32].LogicalTileHeight = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x32].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x32].LogicalSize = 0x8000;
    (this->super_PlatformInfo).Data.TileInfo[0x32].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x32].MaxMipTailStartWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x32].MaxMipTailStartHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x32].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x31].LogicalTileWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x31].LogicalTileHeight = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x31].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x31].LogicalSize = 0x8000;
    (this->super_PlatformInfo).Data.TileInfo[0x31].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x31].MaxMipTailStartWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x31].MaxMipTailStartHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x31].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x30].LogicalTileWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x30].LogicalTileHeight = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x30].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x30].LogicalSize = 0x8000;
    (this->super_PlatformInfo).Data.TileInfo[0x30].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x30].MaxMipTailStartWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x30].MaxMipTailStartHeight = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x30].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x39].LogicalTileWidth = 0x200;
    (this->super_PlatformInfo).Data.TileInfo[0x39].LogicalTileHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x39].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x39].LogicalSize = 0x4000;
    (this->super_PlatformInfo).Data.TileInfo[0x39].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x39].MaxMipTailStartWidth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x39].MaxMipTailStartHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x39].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x38].LogicalTileWidth = 0x200;
    (this->super_PlatformInfo).Data.TileInfo[0x38].LogicalTileHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x38].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x38].LogicalSize = 0x4000;
    (this->super_PlatformInfo).Data.TileInfo[0x38].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x38].MaxMipTailStartWidth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x38].MaxMipTailStartHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x38].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x37].LogicalTileWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x37].LogicalTileHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x37].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x37].LogicalSize = 0x4000;
    (this->super_PlatformInfo).Data.TileInfo[0x37].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x37].MaxMipTailStartWidth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x37].MaxMipTailStartHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x37].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x36].LogicalTileWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x36].LogicalTileHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x36].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x36].LogicalSize = 0x4000;
    (this->super_PlatformInfo).Data.TileInfo[0x36].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x36].MaxMipTailStartWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x36].MaxMipTailStartHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x36].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x35].LogicalTileWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x35].LogicalTileHeight = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x35].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x35].LogicalSize = 0x4000;
    (this->super_PlatformInfo).Data.TileInfo[0x35].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x35].MaxMipTailStartWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x35].MaxMipTailStartHeight = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x35].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x3e].LogicalTileWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x3e].LogicalTileHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x3e].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x3e].LogicalSize = 0x2000;
    (this->super_PlatformInfo).Data.TileInfo[0x3e].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x3e].MaxMipTailStartWidth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x3e].MaxMipTailStartHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x3e].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x3d].LogicalTileWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x3d].LogicalTileHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x3d].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x3d].LogicalSize = 0x2000;
    (this->super_PlatformInfo).Data.TileInfo[0x3d].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x3d].MaxMipTailStartWidth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x3d].MaxMipTailStartHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x3d].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x3c].LogicalTileWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x3c].LogicalTileHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x3c].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x3c].LogicalSize = 0x2000;
    (this->super_PlatformInfo).Data.TileInfo[0x3c].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x3c].MaxMipTailStartWidth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x3c].MaxMipTailStartHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x3c].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x3b].LogicalTileWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x3b].LogicalTileHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x3b].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x3b].LogicalSize = 0x2000;
    (this->super_PlatformInfo).Data.TileInfo[0x3b].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x3b].MaxMipTailStartWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x3b].MaxMipTailStartHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x3b].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x3a].LogicalTileWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x3a].LogicalTileHeight = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x3a].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x3a].LogicalSize = 0x2000;
    (this->super_PlatformInfo).Data.TileInfo[0x3a].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x3a].MaxMipTailStartWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x3a].MaxMipTailStartHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x3a].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x43].LogicalTileWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x43].LogicalTileHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x43].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x43].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0x43].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x43].MaxMipTailStartWidth = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x43].MaxMipTailStartHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x43].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x42].LogicalTileWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x42].LogicalTileHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x42].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x42].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0x42].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x42].MaxMipTailStartWidth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x42].MaxMipTailStartHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x42].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x41].LogicalTileWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x41].LogicalTileHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x41].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x41].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0x41].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x41].MaxMipTailStartWidth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x41].MaxMipTailStartHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x41].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x40].LogicalTileWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x40].LogicalTileHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x40].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x40].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0x40].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x40].MaxMipTailStartWidth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x40].MaxMipTailStartHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x40].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x3f].LogicalTileWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x3f].LogicalTileHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x3f].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x3f].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0x3f].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x3f].MaxMipTailStartWidth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x3f].MaxMipTailStartHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x3f].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x48].LogicalTileWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x48].LogicalTileHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x48].LogicalTileDepth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x48].LogicalSize = 0x10000;
    (this->super_PlatformInfo).Data.TileInfo[0x48].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x48].MaxMipTailStartWidth = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x48].MaxMipTailStartHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x48].MaxMipTailStartDepth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x47].LogicalTileWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x47].LogicalTileHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x47].LogicalTileDepth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x47].LogicalSize = 0x10000;
    (this->super_PlatformInfo).Data.TileInfo[0x47].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x47].MaxMipTailStartWidth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x47].MaxMipTailStartHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x47].MaxMipTailStartDepth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x46].LogicalTileWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0x46].LogicalTileHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x46].LogicalTileDepth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x46].LogicalSize = 0x10000;
    (this->super_PlatformInfo).Data.TileInfo[0x46].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x46].MaxMipTailStartWidth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x46].MaxMipTailStartHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x46].MaxMipTailStartDepth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x45].LogicalTileWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x45].LogicalTileHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x45].LogicalTileDepth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x45].LogicalSize = 0x10000;
    (this->super_PlatformInfo).Data.TileInfo[0x45].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x45].MaxMipTailStartWidth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x45].MaxMipTailStartHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x45].MaxMipTailStartDepth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x44].LogicalTileWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x44].LogicalTileHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x44].LogicalTileDepth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x44].LogicalSize = 0x10000;
    (this->super_PlatformInfo).Data.TileInfo[0x44].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x44].MaxMipTailStartWidth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x44].MaxMipTailStartHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x44].MaxMipTailStartDepth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[7].LogicalTileWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[7].LogicalTileHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[7].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[7].LogicalSize = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[7].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[7].MaxMipTailStartWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[7].MaxMipTailStartHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[7].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[6].LogicalTileWidth = 0x200;
    (this->super_PlatformInfo).Data.TileInfo[6].LogicalTileHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[6].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[6].LogicalSize = 0x200;
    (this->super_PlatformInfo).Data.TileInfo[6].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[6].MaxMipTailStartWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[6].MaxMipTailStartHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[6].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[5].LogicalTileWidth = 0x400;
    (this->super_PlatformInfo).Data.TileInfo[5].LogicalTileHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[5].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[5].LogicalSize = 0x400;
    (this->super_PlatformInfo).Data.TileInfo[5].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[5].MaxMipTailStartWidth = 0x200;
    (this->super_PlatformInfo).Data.TileInfo[5].MaxMipTailStartHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[5].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[4].LogicalTileWidth = 0x800;
    (this->super_PlatformInfo).Data.TileInfo[4].LogicalTileHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[4].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[4].LogicalSize = 0x800;
    (this->super_PlatformInfo).Data.TileInfo[4].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[4].MaxMipTailStartWidth = 0x400;
    (this->super_PlatformInfo).Data.TileInfo[4].MaxMipTailStartHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[4].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[3].LogicalTileWidth = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[3].LogicalTileHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[3].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[3].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[3].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[3].MaxMipTailStartWidth = 0x800;
    (this->super_PlatformInfo).Data.TileInfo[3].MaxMipTailStartHeight = 1;
    (this->super_PlatformInfo).Data.TileInfo[3].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x11].LogicalTileWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x11].LogicalTileHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x11].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x11].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0x11].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x11].MaxMipTailStartWidth = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x11].MaxMipTailStartHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x11].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x10].LogicalTileWidth = 0x100;
    (this->super_PlatformInfo).Data.TileInfo[0x10].LogicalTileHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x10].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x10].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0x10].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x10].MaxMipTailStartWidth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x10].MaxMipTailStartHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x10].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0xf].LogicalTileWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0xf].LogicalTileHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0xf].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0xf].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0xf].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0xf].MaxMipTailStartWidth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0xf].MaxMipTailStartHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0xf].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0xe].LogicalTileWidth = 0x80;
    (this->super_PlatformInfo).Data.TileInfo[0xe].LogicalTileHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0xe].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0xe].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0xe].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0xe].MaxMipTailStartWidth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0xe].MaxMipTailStartHeight = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0xe].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0xd].LogicalTileWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0xd].LogicalTileHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0xd].LogicalTileDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0xd].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0xd].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0xd].MaxMipTailStartWidth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0xd].MaxMipTailStartHeight = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0xd].MaxMipTailStartDepth = 1;
    (this->super_PlatformInfo).Data.TileInfo[0x2a].LogicalTileWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x2a].LogicalTileHeight = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x2a].LogicalTileDepth = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x2a].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0x2a].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x2a].MaxMipTailStartWidth = 4;
    (this->super_PlatformInfo).Data.TileInfo[0x2a].MaxMipTailStartHeight = 4;
    (this->super_PlatformInfo).Data.TileInfo[0x2a].MaxMipTailStartDepth = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x29].LogicalTileWidth = 0x40;
    (this->super_PlatformInfo).Data.TileInfo[0x29].LogicalTileHeight = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x29].LogicalTileDepth = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x29].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0x29].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x29].MaxMipTailStartWidth = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x29].MaxMipTailStartHeight = 4;
    (this->super_PlatformInfo).Data.TileInfo[0x29].MaxMipTailStartDepth = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x28].LogicalTileWidth = 0x20;
    (this->super_PlatformInfo).Data.TileInfo[0x28].LogicalTileHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x28].LogicalTileDepth = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x28].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0x28].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x28].MaxMipTailStartWidth = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x28].MaxMipTailStartHeight = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x28].MaxMipTailStartDepth = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x27].LogicalTileWidth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x27].LogicalTileHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x27].LogicalTileDepth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x27].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0x27].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x27].MaxMipTailStartWidth = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x27].MaxMipTailStartHeight = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x27].MaxMipTailStartDepth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x26].LogicalTileWidth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x26].LogicalTileHeight = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x26].LogicalTileDepth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x26].LogicalSize = 0x1000;
    (this->super_PlatformInfo).Data.TileInfo[0x26].MaxPitch = 0x40000;
    (this->super_PlatformInfo).Data.TileInfo[0x26].MaxMipTailStartWidth = 0x10;
    (this->super_PlatformInfo).Data.TileInfo[0x26].MaxMipTailStartHeight = 8;
    (this->super_PlatformInfo).Data.TileInfo[0x26].MaxMipTailStartDepth = 0x10;
    (this->super_PlatformInfo).Data.NumberFenceRegisters =
         (uint)((*(ulong *)&pGmmLibContext->WaTable >> 0x2f & 1) == 0) * 0x10 + 0x10;
    (this->super_PlatformInfo).Data.FenceLowBoundMask = 0xfffff000;
    (this->super_PlatformInfo).Data.MinFenceSize = 0x100000;
    (this->super_PlatformInfo).Data.FenceLowBoundShift = 0xc;
    (this->super_PlatformInfo).Data.PagingBufferPrivateDataSize = 0x1000;
    (this->super_PlatformInfo).Data.MaxLod = 0xe;
    (this->super_PlatformInfo).Data.FBCRequiredStolenMemorySize = 0x800000;
    pGVar1 = &(this->super_PlatformInfo).Data;
    (pGVar1->TexAlign).CCS.Align.Width = 0x80;
    (pGVar1->TexAlign).CCS.Align.Height = 0x40;
    (this->super_PlatformInfo).Data.TexAlign.CCS.MaxPitchinTiles = 0x200;
    (this->super_PlatformInfo).Data.TexAlign.Compressed.Width = 4;
    (this->super_PlatformInfo).Data.TexAlign.Compressed.Height = 4;
    *(undefined8 *)&(this->super_PlatformInfo).Data.TexAlign.Compressed.Depth = 0x400000001;
    (this->super_PlatformInfo).Data.TexAlign.Depth.Height = 4;
    (this->super_PlatformInfo).Data.TexAlign.Depth_D16_UNORM_1x_4x_16x.Width = 8;
    (this->super_PlatformInfo).Data.TexAlign.Depth_D16_UNORM_1x_4x_16x.Height = 4;
    (this->super_PlatformInfo).Data.TexAlign.Depth_D16_UNORM_2x_8x.Width = 8;
    (this->super_PlatformInfo).Data.TexAlign.Depth_D16_UNORM_2x_8x.Height = 4;
    (this->super_PlatformInfo).Data.TexAlign.SeparateStencil.Width = 8;
    (this->super_PlatformInfo).Data.TexAlign.SeparateStencil.Height = 8;
    (this->super_PlatformInfo).Data.TexAlign.YUV422.Width = 4;
    (this->super_PlatformInfo).Data.TexAlign.YUV422.Height = 4;
    (this->super_PlatformInfo).Data.TexAlign.AllOther.Width = 0x10;
    (this->super_PlatformInfo).Data.TexAlign.AllOther.Height = 4;
    (this->super_PlatformInfo).Data.TexAlign.XAdapter.Width = 1;
    (this->super_PlatformInfo).Data.TexAlign.XAdapter.Height = 4;
    (this->super_PlatformInfo).Data.SurfaceStateYOffsetGranularity = 4;
    (this->super_PlatformInfo).Data.SamplerFetchGranularityWidth = 4;
    (this->super_PlatformInfo).Data.SamplerFetchGranularityHeight = 4;
    (this->super_PlatformInfo).Data.XAdapter.Alignment = 0x10000;
    (this->super_PlatformInfo).Data.XAdapter.PitchAlignment = 0x80;
    (this->super_PlatformInfo).Data.XAdapter.RenderPitchAlignment = 0x80;
    (this->super_PlatformInfo).Data.XAdapter.LockPitchAlignment = 0x80;
    (this->super_PlatformInfo).Data.XAdapter.MinPitch = 0x20;
    (this->super_PlatformInfo).Data.XAdapter.MaxPitch =
         (ulong)((*(ulong *)&pGmmLibContext->WaTable >> 0x2c & 1) == 0) * 0x20000 + 0x20000;
    (this->super_PlatformInfo).Data.XAdapter.MinAllocationSize = 0x1000;
    (this->super_PlatformInfo).Data.XAdapter.MinHeight = 1;
    (this->super_PlatformInfo).Data.XAdapter.MinWidth = 1;
    (this->super_PlatformInfo).Data.XAdapter.MinDepth = 0;
    (this->super_PlatformInfo).Data.XAdapter.MaxHeight = 0x4000;
    (this->super_PlatformInfo).Data.XAdapter.MaxWidth = 0x4000;
    (this->super_PlatformInfo).Data.XAdapter.MaxDepth = 0xffffffff;
    (this->super_PlatformInfo).Data.XAdapter.MaxArraySize = 0x800;
    (this->super_PlatformInfo).Data.SurfaceMaxSize = 0x4000000000;
    (this->super_PlatformInfo).Data.MaxGpuVirtualAddressBitsPerResource = 0x26;
    uVar2 = 0x90000;
    if ((this->super_PlatformInfo).Data.Platform.eProductFamily - IGFX_KABYLAKE < 2) {
      uVar2 = 0xf0000;
    }
    (this->super_PlatformInfo).Data.MaxSLMSize = uVar2;
    (this->super_PlatformInfo).Data.HiZPixelsPerByte = '\x02';
    GVar9 = (this->super_PlatformInfo).Data.Texture2DSurface.MaxWidth;
    (this->super_PlatformInfo).Data.ReconMaxHeight =
         (this->super_PlatformInfo).Data.Texture2DSurface.MaxHeight;
    (this->super_PlatformInfo).Data.ReconMaxWidth = GVar9;
    (this->super_PlatformInfo).Data.NoOfBitsSupported = '\'';
    (this->super_PlatformInfo).Data.HighestAcceptablePhysicalAddress = 0x7fffffffff;
  }
  return;
}

Assistant:

GmmLib::PlatformInfoGen9::PlatformInfoGen9(PLATFORM &Platform, Context *pGmmLibContext)
    : PlatformInfo(Platform, pGmmLibContext)
{
    __GMM_ASSERTPTR(pGmmLibContext, VOIDRETURN);

    // --------------------------
    // Non Native Dispay Interface buffer restriction. Register Ref: DSPACNTR, DSPASTRIDE, DSPASURF
    // Clamping res based on 2 Nndi buffers and GMM_NNDI_SEGMENT_SIZE reserved gfx memory
    // --------------------------
    Data.Nndi.Alignment            = PAGE_SIZE;
    Data.Nndi.PitchAlignment       = GMM_BYTES(1);
    Data.Nndi.RenderPitchAlignment = GMM_BYTES(1);
    Data.Nndi.LockPitchAlignment   = GMM_BYTES(1);
    Data.Nndi.MinPitch             = GMM_BYTES(640);
    Data.Nndi.MaxPitch             = GMM_BYTES(8192);
    Data.Nndi.MinAllocationSize    = PAGE_SIZE;
    Data.Nndi.MinHeight            = GMM_SCANLINES(200);
    Data.Nndi.MinWidth             = GMM_PIXELS(320);
    Data.Nndi.MinDepth             = 0;
    Data.Nndi.MaxHeight            = GMM_BYTES(1536);
    Data.Nndi.MaxWidth             = GMM_BYTES(2048);
    Data.Nndi.MaxDepth             = 1;
    Data.Nndi.MaxArraySize         = 1;

    // --------------------------
    // Depth Buffer Restriction. Inst Ref: 3DSTATE_DEPTH_BUFFER
    // --------------------------
    Data.Depth.Alignment            = PAGE_SIZE;
    Data.Depth.PitchAlignment       = GMM_BYTES(64);
    Data.Depth.RenderPitchAlignment = GMM_BYTES(64);
    Data.Depth.LockPitchAlignment   = GMM_BYTES(64);
    Data.Depth.MinPitch             = GMM_BYTES(64);
    Data.Depth.MaxPitch             = GMM_KBYTE(128); // 3DSTATE_DEPTH_BUFFER has conflicting info--but 128KB should be fine.
    Data.Depth.MinAllocationSize    = PAGE_SIZE;
    Data.Depth.MinHeight            = GMM_SCANLINES(1);
    Data.Depth.MinWidth             = GMM_PIXELS(1);
    Data.Depth.MinDepth             = 0;
    Data.Depth.MaxHeight            = GMM_KBYTE(16);
    Data.Depth.MaxWidth             = GMM_KBYTE(16);
    Data.Depth.MaxDepth             = GMM_KBYTE(2);
    Data.Depth.MaxArraySize         = GMM_KBYTE(2);

    // --------------------------
    // Stencil Buffer Restriction. Inst Ref: 3DSTATE_STENCIL_BUFFER
    // --------------------------
    Data.Stencil.Alignment            = PAGE_SIZE;
    Data.Stencil.PitchAlignment       = GMM_BYTES(128);
    Data.Stencil.RenderPitchAlignment = GMM_BYTES(128);
    Data.Stencil.LockPitchAlignment   = GMM_BYTES(128);
    Data.Stencil.MinPitch             = GMM_BYTES(128);
    Data.Stencil.MaxPitch             = GMM_KBYTE(128); // 3DSTATE_STENCIL_BUFFER: 2*Pitch <= 128KB (GMM client allocs 2x-width, so GMM limits to that.)
    Data.Stencil.MinAllocationSize    = PAGE_SIZE;
    Data.Stencil.MinHeight            = GMM_SCANLINES(1);
    Data.Stencil.MinWidth             = GMM_PIXELS(1);
    Data.Stencil.MinDepth             = 0;
    Data.Stencil.MaxHeight            = GMM_KBYTE(16);
    Data.Stencil.MaxWidth             = GMM_KBYTE(16);
    Data.Stencil.MaxDepth             = GMM_KBYTE(2);
    Data.Stencil.MaxArraySize         = GMM_KBYTE(2);

    // --------------------------
    // Hierarchical Depth Buffer Restriction. Inst Ref: 3DSTATE_HIER_DEPTH_BUFFER
    // --------------------------
    Data.HiZ.Alignment            = PAGE_SIZE;
    Data.HiZ.PitchAlignment       = GMM_BYTES(128);
    Data.HiZ.RenderPitchAlignment = GMM_BYTES(128);
    Data.HiZ.LockPitchAlignment   = GMM_BYTES(128);
    Data.HiZ.MinPitch             = GMM_BYTES(128);
    Data.HiZ.MaxPitch             = GMM_KBYTE(128);
    Data.HiZ.MinAllocationSize    = PAGE_SIZE;
    Data.HiZ.MinHeight            = GMM_SCANLINES(1);
    Data.HiZ.MinWidth             = GMM_PIXELS(1);
    Data.HiZ.MinDepth             = 0;
    Data.HiZ.MaxHeight            = GMM_KBYTE(16);
    Data.HiZ.MaxWidth             = GMM_KBYTE(16);
    Data.HiZ.MaxDepth             = GMM_KBYTE(2);
    Data.HiZ.MaxArraySize         = GMM_KBYTE(2);

    // --------------------------
    // Vertex Restriction. Inst Ref: 3DSTATE_VERTEX_BUFFER, 3DSTATE_INSTANCE_STEP_RATE
    // Note: restrictions are expanded here for UMD flexibility.
    // --------------------------
    Data.Vertex.Alignment            = PAGE_SIZE;
    Data.Vertex.PitchAlignment       = GMM_BYTES(1);
    Data.Vertex.LockPitchAlignment   = GMM_BYTES(1);
    Data.Vertex.RenderPitchAlignment = GMM_BYTES(1);
    Data.Vertex.MinPitch             = GMM_BYTES(1);
    Data.Vertex.MaxPitch             = GMM_GBYTE(2);
    Data.Vertex.MinAllocationSize    = PAGE_SIZE;
    Data.Vertex.MinHeight            = GMM_SCANLINES(1);
    Data.Vertex.MinWidth             = GMM_PIXELS(1);
    Data.Vertex.MinDepth             = 0;
    Data.Vertex.MaxHeight            = GMM_MBYTE(128); //TODO(Minor): How does Media fail when we change this to 1?!
    Data.Vertex.MaxWidth             = GMM_GBYTE(2);
    Data.Vertex.MaxDepth             = GMM_KBYTE(2);
    Data.Vertex.MaxArraySize         = GMM_KBYTE(2);

    // --------------------------
    // Index Buffer Restriction. Inst Ref: 3DSTATE_INDEX_BUFFER
    // --------------------------
    Data.Index = Data.Vertex;

    // --------------------------
    // Linear Buffer Restriction. General purpose. Flexible.
    // --------------------------
    Data.Linear.Alignment            = PAGE_SIZE;
    Data.Linear.PitchAlignment       = GMM_BYTES(1);
    Data.Linear.LockPitchAlignment   = GMM_BYTES(1);
    Data.Linear.RenderPitchAlignment = GMM_BYTES(1);
    Data.Linear.MinPitch             = GMM_BYTES(1);
    Data.Linear.MaxPitch             = GMM_GBYTE(256);
    Data.Linear.MinAllocationSize    = PAGE_SIZE;
    Data.Linear.MinHeight            = GMM_SCANLINES(1);
    Data.Linear.MinWidth             = GMM_PIXELS(1);
    Data.Linear.MinDepth             = 0;
    Data.Linear.MaxHeight            = 1;
    Data.Linear.MaxWidth             = GMM_GBYTE(256);
    Data.Linear.MaxDepth             = 1;
    Data.Linear.MaxArraySize         = 1;

    // --------------------------
    // No Surface Restriction. General purpose. Flexible.
    // --------------------------
    Data.NoRestriction.Alignment            = PAGE_SIZE;
    Data.NoRestriction.PitchAlignment       = GMM_BYTES(1);
    Data.NoRestriction.LockPitchAlignment   = GMM_BYTES(1);
    Data.NoRestriction.RenderPitchAlignment = GMM_BYTES(1);
    Data.NoRestriction.MinPitch             = GMM_BYTES(1);
    Data.NoRestriction.MaxPitch             = GMM_TBYTE(128);
    Data.NoRestriction.MinAllocationSize    = PAGE_SIZE;
    Data.NoRestriction.MinHeight            = GMM_SCANLINES(1);
    Data.NoRestriction.MinWidth             = GMM_PIXELS(1);
    Data.NoRestriction.MinDepth             = 0;
    Data.NoRestriction.MaxHeight            = GMM_GBYTE(256);
    Data.NoRestriction.MaxWidth             = GMM_TBYTE(128);
    Data.NoRestriction.MaxDepth             = GMM_KBYTE(2);
    Data.NoRestriction.MaxArraySize         = GMM_KBYTE(2);

    // --------------------------
    // Constant Buffer Restriction.
    // --------------------------
    Data.Constant = Data.NoRestriction;

    // --------------------------
    // Dx9 Constant Buffer pool Restriction. Inst Ref: 3DSTATE_DX9_CONSTANT_BUFFER_POOL_ALLOC
    // --------------------------
    Data.StateDx9ConstantBuffer           = Data.NoRestriction;
    Data.StateDx9ConstantBuffer.Alignment = GMM_KBYTE(8);

    // --------------------------
    // MC Buffer Restriction
    // --------------------------
    Data.MotionComp                      = Data.NoRestriction;
    Data.MotionComp.Alignment            = PAGE_SIZE;
    Data.MotionComp.PitchAlignment       = GMM_BYTES(32);
    Data.MotionComp.LockPitchAlignment   = GMM_BYTES(32);
    Data.MotionComp.RenderPitchAlignment = GMM_BYTES(32);
    Data.MotionComp.MinPitch             = GMM_BYTES(32);

    // --------------------------
    // Stream Buffer Restriction
    // --------------------------
    Data.Stream = Data.NoRestriction;

    // --------------------------
    // Interlace Scan Buffer Restriction
    // --------------------------
    Data.InterlacedScan = Data.NoRestriction;

    // --------------------------
    // Text API Buffer Restriction
    // --------------------------
    Data.TextApi = Data.NoRestriction;

    // --------------------------
    // RT & Texture2DSurface restrictions. Inst Ref: SURFACE_STATE
    // Greatest common restriction source comes from 8bpp RT
    // --------------------------
    Data.Texture2DSurface.Alignment            = PAGE_SIZE;
    Data.Texture2DSurface.PitchAlignment       = GMM_BYTES(32);
    Data.Texture2DSurface.LockPitchAlignment   = GMM_BYTES(32);
    Data.Texture2DSurface.RenderPitchAlignment = GMM_BYTES(32);
    Data.Texture2DSurface.MinPitch             = GMM_BYTES(32);
    Data.Texture2DSurface.MaxPitch             = (pGmmLibContext->GetWaTable().WaRestrictPitch128KB) ? GMM_KBYTE(128) : GMM_KBYTE(256);
    Data.Texture2DSurface.MinAllocationSize    = PAGE_SIZE;
    Data.Texture2DSurface.MinHeight            = GMM_SCANLINES(1);
    Data.Texture2DSurface.MinWidth             = GMM_PIXELS(1);
    Data.Texture2DSurface.MinDepth             = 0;
    Data.Texture2DSurface.MaxHeight            = GMM_KBYTE(16);
    Data.Texture2DSurface.MaxWidth             = GMM_KBYTE(16);
    Data.Texture2DSurface.MaxDepth             = GMM_FIELD_NA;
    Data.Texture2DSurface.MaxArraySize         = GMM_KBYTE(2);

    {
        // Linear surfaces accessed with Media Block Read/Write commands
        // require 64-byte-aligned pitch. Such commands only operate on 2D
        // resources, so we'll handle the requirement here. Though requirement
        // applies to linear surfaces only, our up'ing the pitch alignment to
        // 64 bytes here won't affect tiled surfaces, since their pitch
        // alignment is never smaller than that.
        Data.Texture2DLinearSurface                      = Data.Texture2DSurface;
        Data.Texture2DLinearSurface.PitchAlignment       = GFX_MAX(GMM_BYTES(64), Data.Texture2DSurface.PitchAlignment);
        Data.Texture2DLinearSurface.LockPitchAlignment   = GFX_MAX(GMM_BYTES(64), Data.Texture2DSurface.LockPitchAlignment);
        Data.Texture2DLinearSurface.RenderPitchAlignment = GFX_MAX(GMM_BYTES(64), Data.Texture2DSurface.RenderPitchAlignment);
    }

    // --------------------------
    // AsyncFlip Restriction. Register Ref: PRI_STRIDE, PRI_SURF, SRCSZ <-- TODO(Minor): SRCSZ correct reg for W/H req's?
    // --------------------------
    Data.ASyncFlipSurface.Alignment            = GMM_KBYTE(256);
    Data.ASyncFlipSurface.PitchAlignment       = GMM_BYTES(64);
    Data.ASyncFlipSurface.RenderPitchAlignment = GMM_BYTES(64);
    Data.ASyncFlipSurface.LockPitchAlignment   = GMM_BYTES(64);
    Data.ASyncFlipSurface.MinPitch             = GMM_BYTES(64);
    Data.ASyncFlipSurface.MaxPitch             = Data.Texture2DSurface.MaxPitch;
    Data.ASyncFlipSurface.MinAllocationSize    = PAGE_SIZE;
    Data.ASyncFlipSurface.MinHeight            = GMM_SCANLINES(1);
    Data.ASyncFlipSurface.MinWidth             = GMM_PIXELS(1);
    Data.ASyncFlipSurface.MinDepth             = 0;
    Data.ASyncFlipSurface.MaxHeight            = Data.Texture2DSurface.MaxHeight; // Beyond DE requirements-Necessary for mosaic framebuffers
    Data.ASyncFlipSurface.MaxWidth             = Data.Texture2DSurface.MaxWidth;  // Okay since GMM isn't actual display requirement gatekeeper.
    Data.ASyncFlipSurface.MaxDepth             = 1;
    Data.ASyncFlipSurface.MaxArraySize         = GMM_KBYTE(2);

    // --------------------------
    // Hardware MBM Restriction.
    // --------------------------
    Data.HardwareMBM = Data.ASyncFlipSurface;

    // --------------------------
    // Video Buffer Restriction
    // --------------------------
    Data.Video = Data.Texture2DLinearSurface;

    // --------------------------
    // Overlay Buffer Restriction. Overlay buffer restriction will be same as Async flip surface since SKL has universal planes.
    // --------------------------
    Data.Overlay = Data.ASyncFlipSurface;

    // --------------------------
    // RT & CubeSurface restrictions. Inst Ref: SURFACE_STATE
    // Greatest common restriction source comes from 8bpp RT
    // --------------------------
    Data.CubeSurface.Alignment            = PAGE_SIZE;
    Data.CubeSurface.PitchAlignment       = GMM_BYTES(32);
    Data.CubeSurface.LockPitchAlignment   = GMM_BYTES(32);
    Data.CubeSurface.RenderPitchAlignment = GMM_BYTES(32);
    Data.CubeSurface.MinPitch             = GMM_BYTES(32);
    Data.CubeSurface.MaxPitch             = (pGmmLibContext->GetWaTable().WaRestrictPitch128KB) ? GMM_KBYTE(128) : GMM_KBYTE(256);
    Data.CubeSurface.MinAllocationSize    = PAGE_SIZE;
    Data.CubeSurface.MinHeight            = GMM_SCANLINES(1);
    Data.CubeSurface.MinWidth             = GMM_PIXELS(1);
    Data.CubeSurface.MinDepth             = 0;
    Data.CubeSurface.MaxHeight            = GMM_KBYTE(16);
    Data.CubeSurface.MaxWidth             = GMM_KBYTE(16);
    Data.CubeSurface.MaxDepth             = 1;
    Data.CubeSurface.MaxArraySize         = GMM_KBYTE(2) / 6; // MaxElements / Cubefaces

    // --------------------------
    // RT & 3D Surface restrictions. Inst Ref: SURFACE_STATE
    // Greatest common restriction source comes from 8bpp RT
    // --------------------------
    Data.Texture3DSurface.Alignment            = PAGE_SIZE;
    Data.Texture3DSurface.PitchAlignment       = GMM_BYTES(32);
    Data.Texture3DSurface.LockPitchAlignment   = GMM_BYTES(32);
    Data.Texture3DSurface.RenderPitchAlignment = GMM_BYTES(32);
    Data.Texture3DSurface.MinPitch             = GMM_BYTES(32);
    Data.Texture3DSurface.MaxPitch             = (pGmmLibContext->GetWaTable().WaRestrictPitch128KB) ? GMM_KBYTE(128) : GMM_KBYTE(256);
    Data.Texture3DSurface.MinAllocationSize    = PAGE_SIZE;
    Data.Texture3DSurface.MinHeight            = GMM_SCANLINES(1);
    Data.Texture3DSurface.MinWidth             = GMM_PIXELS(1);
    Data.Texture3DSurface.MinDepth             = 0;
    Data.Texture3DSurface.MaxHeight            = GMM_KBYTE(16);
    Data.Texture3DSurface.MaxWidth             = GMM_KBYTE(16);
    Data.Texture3DSurface.MaxDepth             = GMM_KBYTE(2);
    Data.Texture3DSurface.MaxArraySize         = GMM_FIELD_NA;

    // --------------------------
    // RT & Buffer Type restrictions. Inst Ref: SURFACE_STATE
    // Greatest common restriction source comes from 8bpp RT
    // --------------------------
    Data.BufferType.Alignment            = PAGE_SIZE;
    Data.BufferType.PitchAlignment       = GMM_BYTES(32);
    Data.BufferType.LockPitchAlignment   = GMM_BYTES(32);
    Data.BufferType.RenderPitchAlignment = GMM_BYTES(32);
    Data.BufferType.MinPitch             = GMM_BYTES(32);
    Data.BufferType.MaxPitch             = GMM_GBYTE(256);
    Data.BufferType.MinAllocationSize    = PAGE_SIZE;
    Data.BufferType.MinHeight            = GMM_SCANLINES(0);
    Data.BufferType.MinWidth             = GMM_PIXELS(1);
    Data.BufferType.MinDepth             = 0;
    Data.BufferType.MaxHeight            = GMM_SCANLINES(1);
    Data.BufferType.MaxWidth             = GMM_GBYTE(256);
    Data.BufferType.MaxDepth             = GMM_FIELD_NA;
    Data.BufferType.MaxArraySize         = GMM_GBYTE(2);

    // --------------------------
    // Cursor surface restricion. Register Ref: CURACNTR, CURABASE
    // --------------------------
    Data.Cursor.Alignment            = pGmmLibContext->GetWaTable().WaCursor16K ? GMM_KBYTE(16) : PAGE_SIZE;
    Data.Cursor.PitchAlignment       = 1;
    Data.Cursor.LockPitchAlignment   = 1;
    Data.Cursor.RenderPitchAlignment = 1;
    Data.Cursor.MinPitch             = 1;
    Data.Cursor.MaxPitch             = 0xffffffff;
    Data.Cursor.MinAllocationSize    = 1;
    Data.Cursor.MinHeight            = GMM_SCANLINES(1);
    Data.Cursor.MinWidth             = 1;
    Data.Cursor.MinDepth             = 0;
    Data.Cursor.MaxHeight            = 0xffffffff;
    Data.Cursor.MaxWidth             = 0xffffffff;
    Data.Cursor.MaxDepth             = 0xffffffff;
    Data.Cursor.MaxArraySize         = 1;

    // clang-format off
    /******************************************************************************************************/
    /***************************************   Width,   Height,    Depth,  MtsWidth,  MtsHeight, MtsDepth */
    /******************************************************************************************************/
    // Legacy TILE_X/Y
    SET_TILE_MODE_INFO(LEGACY_TILE_X,            512,        8,        1,         0,         0,         0)
    SET_TILE_MODE_INFO(LEGACY_TILE_Y,            128,       32,        1,         0,         0,         0)
    // YS 1D
    SET_TILE_MODE_INFO(TILE_YS_1D_128bpe,       4096,        1,        1,      2048,         1,         1)
    SET_TILE_MODE_INFO(TILE_YS_1D_64bpe,        8192,        1,        1,      4096,         1,         1)
    SET_TILE_MODE_INFO(TILE_YS_1D_32bpe,       16384,        1,        1,      8192,         1,         1)
    SET_TILE_MODE_INFO(TILE_YS_1D_16bpe,       32768,        1,        1,     16384,         1,         1)
    SET_TILE_MODE_INFO(TILE_YS_1D_8bpe,        65536,        1,        1,     32768,         1,         1)
    // YS 2D
    SET_TILE_MODE_INFO(TILE_YS_2D_128bpe,       1024,       64,        1,        32,        64,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_64bpe,        1024,       64,        1,        64,        64,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_32bpe,         512,      128,        1,        64,       128,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_16bpe,         512,      128,        1,       128,       128,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_8bpe,          256,      256,        1,       128,       256,         1)
    // YS 2D 2X
    SET_TILE_MODE_INFO(TILE_YS_2D_2X_128bpe,     512,       64,        1,        32,        32,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_2X_64bpe,      512,       64,        1,        64,        32,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_2X_32bpe,      256,      128,        1,        64,        64,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_2X_16bpe,      256,      128,        1,       128,        64,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_2X_8bpe,       128,      256,        1,       128,       128,         1)
    // YS 2D 4X
    SET_TILE_MODE_INFO(TILE_YS_2D_4X_128bpe,     512,       32,        1,        16,        32,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_4X_64bpe,      512,       32,        1,        32,        32,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_4X_32bpe,      256,       64,        1,        32,        64,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_4X_16bpe,      256,       64,        1,        64,        64,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_4X_8bpe,       128,      128,        1,        64,       128,         1)
    // YS 2D 8X
    SET_TILE_MODE_INFO(TILE_YS_2D_8X_128bpe,     256,       32,        1,        16,        16,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_8X_64bpe,      256,       32,        1,        32,        16,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_8X_32bpe,      128,       64,        1,        32,        32,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_8X_16bpe,      128,       64,        1,        64,        32,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_8X_8bpe,        64,      128,        1,        64,        64,         1)
    // YS 2D 16X
    SET_TILE_MODE_INFO(TILE_YS_2D_16X_128bpe,    256,       16,        1,         8,        16,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_16X_64bpe,     256,       16,        1,        16,        16,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_16X_32bpe,     128,       32,        1,        16,        32,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_16X_16bpe,     128,       32,        1,        32,        32,         1)
    SET_TILE_MODE_INFO(TILE_YS_2D_16X_8bpe,       64,       64,        1,        32,        64,         1)
    // YS 3D
    SET_TILE_MODE_INFO(TILE_YS_3D_128bpe,        256,       16,       16,         8,        16,        16)
    SET_TILE_MODE_INFO(TILE_YS_3D_64bpe,         256,       16,       16,        16,        16,        16)
    SET_TILE_MODE_INFO(TILE_YS_3D_32bpe,         128,       32,       16,        16,        32,        16)
    SET_TILE_MODE_INFO(TILE_YS_3D_16bpe,          64,       32,       32,        16,        32,        32)
    SET_TILE_MODE_INFO(TILE_YS_3D_8bpe,           64,       32,       32,        32,        32,        32)
    // YF 1D
    SET_TILE_MODE_INFO(TILE_YF_1D_128bpe,        256,        1,        1,       128,         1,         1)
    SET_TILE_MODE_INFO(TILE_YF_1D_64bpe,         512,        1,        1,       256,         1,         1)
    SET_TILE_MODE_INFO(TILE_YF_1D_32bpe,        1024,        1,        1,       512,         1,         1)
    SET_TILE_MODE_INFO(TILE_YF_1D_16bpe,        2048,        1,        1,      1024,         1,         1)
    SET_TILE_MODE_INFO(TILE_YF_1D_8bpe,         4096,        1,        1,      2048,         1,         1)
    // YF 2D
    SET_TILE_MODE_INFO(TILE_YF_2D_128bpe,        256,       16,        1,         8,        16,         1)
    SET_TILE_MODE_INFO(TILE_YF_2D_64bpe,         256,       16,        1,        16,        16,         1)
    SET_TILE_MODE_INFO(TILE_YF_2D_32bpe,         128,       32,        1,        16,        32,         1)
    SET_TILE_MODE_INFO(TILE_YF_2D_16bpe,         128,       32,        1,        32,        32,         1)
    SET_TILE_MODE_INFO(TILE_YF_2D_8bpe,           64,       64,        1,        32,        64,         1)
    // YF 3D
    SET_TILE_MODE_INFO(TILE_YF_3D_128bpe,         64,        8,        8,         4,         4,         8)
    SET_TILE_MODE_INFO(TILE_YF_3D_64bpe,          64,        8,        8,         8,         4,         8)
    SET_TILE_MODE_INFO(TILE_YF_3D_32bpe,          32,       16,        8,         8,         8,         8)
    SET_TILE_MODE_INFO(TILE_YF_3D_16bpe,          16,       16,       16,         8,         8,        16)
    SET_TILE_MODE_INFO(TILE_YF_3D_8bpe,           16,       16,       16,        16,         8,        16)
    // clang-format on

    //--------------------------
    // Fence paramaters. Register Ref: FENCE
    //--------------------------
    Data.NumberFenceRegisters = pGmmLibContext->GetWaTable().Wa16TileFencesOnly ? 16 : 32;
    Data.FenceLowBoundShift   = 12;
    Data.FenceLowBoundMask    = GFX_MASK(12, 31);
    Data.MinFenceSize         = GMM_MBYTE(1);

    Data.PagingBufferPrivateDataSize = GMM_KBYTE(4);
    Data.MaxLod                      = 14; // [0,14] --> 15 Total

    Data.FBCRequiredStolenMemorySize = GMM_MBYTE(8);

    // --------------------------
    // Surface Alignment Units
    // --------------------------
    Data.TexAlign.CCS.Align.Width                  = 128;
    Data.TexAlign.CCS.Align.Height                 = 64;
    Data.TexAlign.CCS.MaxPitchinTiles              = 512;
    Data.TexAlign.Compressed.Width                 = 4; // No reason for > HALIGN_4.
    Data.TexAlign.Compressed.Height                = 4; // No reason for > VALIGN_4.
    Data.TexAlign.Compressed.Depth                 = 1;
    Data.TexAlign.Depth.Width                      = 4; // See usage for 16bpp HALIGN_8 special-casing.
    Data.TexAlign.Depth.Height                     = 4;
    Data.TexAlign.Depth_D16_UNORM_1x_4x_16x.Width  = 8;
    Data.TexAlign.Depth_D16_UNORM_1x_4x_16x.Height = Data.TexAlign.Depth.Height;
    Data.TexAlign.Depth_D16_UNORM_2x_8x.Width      = 8;
    Data.TexAlign.Depth_D16_UNORM_2x_8x.Height     = Data.TexAlign.Depth.Height;
    Data.TexAlign.SeparateStencil.Width            = 8;
    Data.TexAlign.SeparateStencil.Height           = 8;
    Data.TexAlign.YUV422.Width                     = 4;
    Data.TexAlign.YUV422.Height                    = 4;
    Data.TexAlign.AllOther.Width                   = 16; // HALIGN_16 required for non-MSAA RT's for CCS Fast-Clear and...TBA
    Data.TexAlign.AllOther.Height                  = 4;  // VALIGN_4 should be sufficent.
    Data.TexAlign.XAdapter.Height                  = D3DKMT_CROSS_ADAPTER_RESOURCE_HEIGHT_ALIGNMENT;
    Data.TexAlign.XAdapter.Width                   = 1; //minimum should be one.

    // ----------------------------------
    // SURFACE_STATE YOffset Granularity
    // ----------------------------------
    Data.SurfaceStateYOffsetGranularity = 4;
    Data.SamplerFetchGranularityHeight  = 4;
    Data.SamplerFetchGranularityWidth   = 4;

    // ----------------------------------
    // Restrictions for Cross adapter resource
    // ----------------------------------
    Data.XAdapter.Alignment            = GMM_KBYTE(64); //64KB for DX12/StdSwizzle--Not worth special-casing.
    Data.XAdapter.PitchAlignment       = GMM_BYTES(D3DKMT_CROSS_ADAPTER_RESOURCE_PITCH_ALIGNMENT);
    Data.XAdapter.RenderPitchAlignment = GMM_BYTES(D3DKMT_CROSS_ADAPTER_RESOURCE_PITCH_ALIGNMENT);
    Data.XAdapter.LockPitchAlignment   = GMM_BYTES(D3DKMT_CROSS_ADAPTER_RESOURCE_PITCH_ALIGNMENT);
    Data.XAdapter.MinPitch             = GMM_BYTES(32);
    Data.XAdapter.MaxPitch             = (pGmmLibContext->GetWaTable().WaRestrictPitch128KB) ? GMM_KBYTE(128) : GMM_KBYTE(256);
    Data.XAdapter.MinAllocationSize    = PAGE_SIZE;
    Data.XAdapter.MinHeight            = GMM_SCANLINES(1);
    Data.XAdapter.MinWidth             = GMM_PIXELS(1);
    Data.XAdapter.MinDepth             = 0;
    Data.XAdapter.MaxHeight            = GMM_KBYTE(16);
    Data.XAdapter.MaxWidth             = GMM_KBYTE(16);
    Data.XAdapter.MaxDepth             = GMM_FIELD_NA;
    Data.XAdapter.MaxArraySize         = GMM_KBYTE(2);

    //---------------------------------------------
    //MaxSize for any surface type
    //---------------------------------------------
    Data.SurfaceMaxSize                      = GMM_GBYTE(256);
    Data.MaxGpuVirtualAddressBitsPerResource = 38;

    if(GFX_IS_PRODUCT(Data.Platform, IGFX_KABYLAKE) ||
       GFX_IS_PRODUCT(Data.Platform, IGFX_COFFEELAKE))
    {
        Data.MaxSLMSize = GMM_KBYTE(960);
    }
    else
    {
        Data.MaxSLMSize = GMM_KBYTE(576);
    }

    Data.HiZPixelsPerByte = 2;

    Data.ReconMaxHeight = Data.Texture2DSurface.MaxHeight; // Reconstructed surfaces require more height and width for higher resolutions.
    Data.ReconMaxWidth  = Data.Texture2DSurface.MaxWidth;

    Data.NoOfBitsSupported                = 39;
    Data.HighestAcceptablePhysicalAddress = GFX_MASK_LARGE(0, 38);
}